

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O0

bool __thiscall Clasp::SolveAlgorithm::hasLimit(SolveAlgorithm *this,Model *m)

{
  bool bVar1;
  uint *puVar2;
  const_reference plVar3;
  ulong *in_RSI;
  long in_RDI;
  size_t end;
  size_t i;
  Enumerator *in_stack_ffffffffffffffc0;
  long lVar4;
  size_type local_30;
  size_type local_2c;
  ulong local_28;
  ulong local_20;
  ulong *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::operator->
            ((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x1e2801);
  bVar1 = Enumerator::tentative(in_stack_ffffffffffffffc0);
  if ((bVar1) || (*local_18 < *(ulong *)(in_RDI + 0x40))) {
    SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *)0x1e2838);
    bVar1 = Enumerator::optimize(in_stack_ffffffffffffffc0);
    if ((!bVar1) ||
       ((local_18[3] == 0 ||
        (bVar1 = bk_lib::pod_vector<long,_std::allocator<long>_>::empty
                           ((pod_vector<long,_std::allocator<long>_> *)(in_RDI + 0x48)), bVar1)))) {
      local_1 = false;
    }
    else {
      local_20 = 0;
      local_2c = bk_lib::pod_vector<long,_std::allocator<long>_>::size
                           ((pod_vector<long,_std::allocator<long>_> *)(in_RDI + 0x48));
      local_30 = bk_lib::pod_vector<long,_std::allocator<long>_>::size
                           ((pod_vector<long,_std::allocator<long>_> *)local_18[3]);
      puVar2 = std::min<unsigned_int>(&local_2c,&local_30);
      local_28 = (ulong)*puVar2;
      for (; local_20 != local_28; local_20 = local_20 + 1) {
        plVar3 = bk_lib::pod_vector<long,_std::allocator<long>_>::operator[]
                           ((pod_vector<long,_std::allocator<long>_> *)(in_RDI + 0x48),
                            (size_type)local_20);
        lVar4 = *plVar3;
        plVar3 = bk_lib::pod_vector<long,_std::allocator<long>_>::operator[]
                           ((pod_vector<long,_std::allocator<long>_> *)local_18[3],
                            (size_type)local_20);
        if (lVar4 != *plVar3) {
          plVar3 = bk_lib::pod_vector<long,_std::allocator<long>_>::operator[]
                             ((pod_vector<long,_std::allocator<long>_> *)local_18[3],
                              (size_type)local_20);
          lVar4 = *plVar3;
          plVar3 = bk_lib::pod_vector<long,_std::allocator<long>_>::operator[]
                             ((pod_vector<long,_std::allocator<long>_> *)(in_RDI + 0x48),
                              (size_type)local_20);
          return lVar4 < *plVar3;
        }
      }
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool SolveAlgorithm::hasLimit(const Model& m) const {
	if (!enum_->tentative() && m.num >= enumLimit_) return true;
	if (enum_->optimize() && m.costs && !optLimit_.empty()) {
		for (std::size_t i = 0, end = std::min(optLimit_.size(), m.costs->size()); i != end; ++i) {
			if (optLimit_[i] != (*m.costs)[i]) {
				return (*m.costs)[i] < optLimit_[i];
			}
		}
		return true;
	}
	return false;
}